

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O0

bool pvmath::houghTransform<double>(void)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  pointer pPVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOffLine;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOnLine;
  double y;
  double x;
  iterator p;
  double cosVal;
  double sinVal;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> point;
  double noiseValue;
  double lineTolerance;
  double angleStep;
  double angleTolerance;
  double angle;
  uint32_t i;
  undefined4 in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffecc;
  __normal_iterator<PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  *in_stack_fffffffffffffed0;
  undefined1 *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  double in_stack_fffffffffffffee8;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_stack_fffffffffffffef0;
  undefined1 local_c0 [24];
  __normal_iterator<PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  local_a8 [3];
  double local_90;
  double local_88;
  PointBase2D<double> *local_80;
  __normal_iterator<PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  local_78;
  double local_70;
  double local_68;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  uint local_8;
  byte local_1;
  
  for (local_8 = 0; uVar1 = local_8, uVar3 = Test_Helper::runCount(), uVar1 < uVar3;
      local_8 = local_8 + 1) {
    dVar6 = Unit_Test::randomFloatValue<double>
                      ((double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                       (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_10 = toRadians(dVar6);
    dVar6 = Unit_Test::randomFloatValue<double>
                      ((double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                       (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    dVar6 = toRadians(dVar6 + 0.10000000149011612);
    local_18 = dVar6;
    iVar4 = Test_Helper::randomValue<int>((int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    local_20 = dVar6 / (double)iVar4;
    local_28 = Unit_Test::randomFloatValue<double>
                         ((double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                          (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_30 = local_28 * 0.5;
    Test_Helper::randomValue<unsigned_int>
              ((uint)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    std::allocator<PointBase2D<double>_>::allocator((allocator<PointBase2D<double>_> *)0x24a6b4);
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::vector
              (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::allocator<PointBase2D<double>_>::~allocator((allocator<PointBase2D<double>_> *)0x24a6da);
    local_68 = sin(local_10);
    local_70 = cos(local_10);
    local_78._M_current =
         (PointBase2D<double> *)
         std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::begin
                   ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    while( true ) {
      local_80 = (PointBase2D<double> *)
                 std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::end
                           ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffed0,
                         (__normal_iterator<PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if (!bVar2) break;
      dVar6 = Unit_Test::randomFloatValue<double>
                        ((double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                         (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_88 = Unit_Test::randomFloatValue<double>
                           ((double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                            (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_88 = dVar6 + local_88;
      local_90 = Unit_Test::randomFloatValue<double>
                           ((double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                            (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_88;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_70;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = -(local_90 * local_68);
      auVar7 = vfmadd213sd_fma(auVar7,auVar9,auVar11);
      in_stack_fffffffffffffee8 = auVar7._0_8_;
      pPVar5 = __gnu_cxx::
               __normal_iterator<PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
               ::operator->(&local_78);
      pPVar5->x = in_stack_fffffffffffffee8;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_88;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_68;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_90 * local_70;
      auVar7 = vfmadd213sd_fma(auVar8,auVar10,auVar12);
      in_stack_fffffffffffffef0 = auVar7._0_8_;
      pPVar5 = __gnu_cxx::
               __normal_iterator<PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
               ::operator->(&local_78);
      pPVar5->y = (double)in_stack_fffffffffffffef0;
      __gnu_cxx::
      __normal_iterator<PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
      ::operator++(&local_78);
    }
    in_stack_fffffffffffffed0 = local_a8;
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::vector
              ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)0x24a90a);
    in_stack_fffffffffffffed8 = local_c0;
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::vector
              ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)0x24a919);
    in_stack_fffffffffffffee7 =
         Image_Function::HoughTransform
                   (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                    (double)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                    (double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                    (vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                    (vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)0x24a954);
    if (((bool)in_stack_fffffffffffffee7) &&
       (bVar2 = std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::empty
                          ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                           CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0)), bVar2)) {
      bVar2 = false;
    }
    else {
      local_1 = 0;
      bVar2 = true;
    }
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~vector
              ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~vector
              ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~vector
              ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    if (bVar2) goto LAB_0024aa18;
  }
  local_1 = 1;
LAB_0024aa18:
  return (bool)(local_1 & 1);
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }